

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asa152.cpp
# Opt level: O3

double chyper(bool point,int kk,int ll,int mm,int nn,int *ifault)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int i2;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  uint uVar27;
  double local_40;
  
  if ((((nn < 0) || (mm < kk)) || (kk < 0)) || (iVar16 = mm - nn, mm < nn)) {
    *ifault = 1;
    return 0.0;
  }
  if ((ll < 0) || (iVar12 = kk - ll, iVar16 < iVar12)) {
    *ifault = 2;
    return 0.0;
  }
  if ((uint)kk < (uint)ll || (uint)nn < (uint)ll) {
    uVar27 = 0;
    if (!point) {
      uVar27 = 0x3ff00000;
    }
    *ifault = 2;
    return (double)((ulong)uVar27 << 0x20);
  }
  *ifault = 0;
  if (kk == 0) {
    return 1.0;
  }
  if (mm == nn) {
    return 1.0;
  }
  i2 = mm - kk;
  if (i2 == 0) {
    return 1.0;
  }
  if (nn == 0) {
    return 1.0;
  }
  if ((!point) && (iVar5 = i4_min(kk,nn), iVar5 == ll)) {
    return 1.0;
  }
  local_40 = (double)nn / (double)iVar16;
  dVar18 = r8_max(local_40,1.0 / local_40);
  iVar5 = i4_min(kk,i2);
  if ((1000 < (uint)mm) && (dVar18 * 16.0 < (double)iVar5)) {
    dVar25 = (double)(nn * kk) / (double)mm;
    dVar18 = ((double)i2 / (double)(mm + -1)) * ((double)iVar16 / (double)mm) * dVar25;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    if (!point) {
      dVar18 = alnorm((((double)ll + 0.5) - dVar25) / dVar18,false);
      return dVar18;
    }
    dVar25 = ((double)ll - dVar25) / dVar18;
    dVar25 = dVar25 * dVar25 * -0.5;
    if (-88.0 <= dVar25) {
      dVar25 = exp(dVar25);
      return dVar25 / (dVar18 * 2.506628274631001);
    }
    return 0.0;
  }
  iVar2 = kk + 1;
  iVar5 = ll + 1;
  iVar1 = mm + 1;
  iVar6 = nn + 1;
  iVar7 = i4_min(nn,iVar16);
  iVar8 = i4_min(kk,i2);
  iVar4 = iVar6;
  iVar13 = iVar2;
  if (iVar7 < iVar8) {
    iVar4 = iVar2;
    iVar13 = iVar6;
  }
  iVar10 = iVar1 - iVar13;
  iVar8 = iVar13 + -1;
  iVar7 = iVar4 - ll;
  if (iVar8 <= iVar10) {
    iVar7 = iVar5;
  }
  bVar3 = iVar8 <= iVar10;
  iVar15 = iVar10 + 1;
  if (iVar8 <= iVar10) {
    iVar15 = iVar13;
  }
  if ((uint)mm < 0x259) {
    dVar18 = 1.0;
    if (1 < iVar7) {
      iVar9 = iVar7 + -1;
      iVar13 = iVar8;
      if (iVar10 < iVar8) {
        iVar13 = iVar10;
      }
      dVar18 = 1.0;
      iVar14 = mm;
      iVar11 = iVar4;
      do {
        iVar11 = iVar11 + -1;
        dVar18 = ((double)(iVar13 * iVar11) * dVar18) / (double)(iVar9 * iVar14);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if (iVar7 < iVar15) {
      iVar9 = iVar1 - iVar4;
      iVar13 = iVar8;
      if (iVar10 < iVar8) {
        iVar13 = iVar10;
      }
      iVar13 = (iVar13 - iVar7) + 1;
      iVar11 = iVar1 - iVar7;
      do {
        dVar18 = (dVar18 * (double)iVar9) / (double)iVar11;
        iVar9 = iVar9 + -1;
        iVar11 = iVar11 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
LAB_001aa3eb:
    if (point) {
      return dVar18;
    }
    if ((dVar18 != 0.0) || (NAN(dVar18))) {
      dVar25 = dVar18 * 1e+35;
      goto LAB_001aa5ce;
    }
    if (mm < 0x259) {
      dVar25 = lgamma((double)iVar6);
      dVar19 = lgamma((double)iVar1);
      dVar20 = lgamma((double)iVar2);
      dVar21 = lgamma((double)(iVar16 + 1));
      dVar22 = lgamma((double)iVar5);
      dVar23 = lgamma((double)((nn - ll) + 1));
      dVar24 = lgamma((double)(iVar12 + 1));
      dVar26 = lgamma((double)((iVar5 - kk) + iVar16));
      local_40 = lgamma((double)(i2 + 1));
      local_40 = local_40 +
                 (((((dVar21 + dVar20 + (dVar25 - dVar19)) - dVar22) - dVar23) - dVar24) - dVar26);
    }
  }
  else {
    dVar18 = lgamma((double)iVar6);
    dVar25 = lgamma((double)iVar1);
    dVar19 = lgamma((double)(i2 + 1));
    dVar20 = lgamma((double)iVar2);
    dVar21 = lgamma((double)(iVar16 + 1));
    dVar22 = lgamma((double)iVar5);
    dVar23 = lgamma((double)((nn - ll) + 1));
    dVar24 = lgamma((double)(iVar12 + 1));
    local_40 = lgamma((double)((ll - kk) + iVar16 + 1));
    local_40 = ((((dVar21 + dVar20 + dVar19 + (dVar18 - dVar25)) - dVar22) - dVar23) - dVar24) -
               local_40;
    if (-88.0 <= local_40) {
      dVar18 = exp(local_40);
      goto LAB_001aa3eb;
    }
    dVar18 = 0.0;
    if (point) {
      return 0.0;
    }
  }
  if (local_40 + 80.5904782547916 < -88.0) {
    *ifault = 3;
    uVar17 = -(ulong)((double)(iVar2 * iVar6) / (double)(mm + 2) < (double)ll);
    return (double)(~uVar17 & (ulong)dVar18 | (ulong)((uint)(uVar17 >> 0x20) & 0x3ff00000) << 0x20);
  }
  dVar25 = exp(local_40 + 80.5904782547916);
LAB_001aa5ce:
  iVar15 = iVar15 - iVar7;
  if (iVar15 < iVar7) {
    bVar3 = iVar10 < iVar8;
    if (iVar15 < 1) {
      dVar19 = 0.0;
    }
    else {
      iVar16 = iVar4 - iVar7;
      iVar12 = (mm - (iVar4 + iVar15)) + 2;
      dVar19 = 0.0;
      do {
        dVar25 = (dVar25 * (double)(iVar16 * iVar15)) / (double)(iVar7 * iVar12);
        dVar19 = dVar19 + dVar25;
        iVar12 = iVar12 + 1;
        iVar7 = iVar7 + 1;
        iVar16 = iVar16 + -1;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
  }
  else {
    dVar19 = 0.0;
    if (1 < iVar7) {
      iVar16 = iVar7 + -1;
      if (iVar10 < iVar8) {
        iVar8 = iVar10;
      }
      iVar12 = (iVar8 - iVar7) + 2;
      iVar7 = iVar4 - iVar7;
      do {
        iVar7 = iVar7 + 1;
        dVar25 = (dVar25 * (double)((((mm - iVar4) - iVar8) + iVar16 + 1) * iVar16)) /
                 (double)(iVar7 * iVar12);
        dVar19 = dVar19 + dVar25;
        iVar12 = iVar12 + 1;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  if ((dVar25 == 0.0) && (!NAN(dVar25))) {
    *ifault = 3;
  }
  if (!bVar3) {
    return 1.0 - dVar19 / 1e+35;
  }
  return dVar18 + dVar19 / 1e+35;
}

Assistant:

double chyper ( bool point, int kk, int ll, int mm, int nn, int *ifault )

//****************************************************************************80
//
//  Purpose:
//
//    CHYPER computes point or cumulative hypergeometric probabilities.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    27 January 2008
//
//  Author:
//
//    Original FORTRAN77 version by Richard Lund.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    PR Freeman,
//    Algorithm AS 59:
//    Hypergeometric Probabilities,
//    Applied Statistics,
//    Volume 22, Number 1, 1973, pages 130-133.
//
//    Richard Lund,
//    Algorithm AS 152:
//    Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 29, Number 2, 1980, pages 221-223.
//
//    BL Shea,
//    Remark AS R77:
//    A Remark on Algorithm AS 152: Cumulative hypergeometric probabilities,
//    Applied Statistics,
//    Volume 38, Number 1, 1989, pages 199-204.
//
//  Parameters:
//
//    Input, bool POINT, is TRUE if the point probability is desired,
//    and FALSE if the cumulative probability is desired.
//
//    Input, int KK, the sample size.
//    0 <= KK <= MM.
//
//    Input, int LL, the number of successes in the sample.
//    0 <= LL <= KK.
//
//    Input, int MM, the population size that was sampled.
//    0 <= MM.
//
//    Input, int NN, the number of "successes" in the population.
//    0 <= NN <= MM.
//
//    Output, int *IFAULT, error flag.
//    0, no error occurred.
//    nonzero, an error occurred.
//
//    Output, double CHYPER, the PDF (point probability) of
//    exactly LL successes out of KK samples, or the CDF (cumulative
//    probability) of up to LL successes out of KK samples.
//
{
  double arg;
  bool dir;
  double elimit = - 88.0;
  int i;
  int j;
  int k;
  int kl;
  int l;
  int m;
  int mbig = 600;
  double mean;
  int mnkl;
  int mvbig = 1000;
  int n;
  int nl;
  double p;
  double pt;
  double rootpi = 2.506628274631001;
  double scale = 1.0E+35;
  double sig;
  double value;

  *ifault = 0;

  k = kk + 1;
  l = ll + 1;
  m = mm + 1;
  n = nn + 1;

  dir = true;
//
//  Check arguments are within permitted limits.
//
  value = 0.0;

  if ( n < 1 || m < n || k < 1 || m < k )
  {
    *ifault = 1;
    return value;
  }

  if ( l < 1 || m - n < k - l )
  {
    *ifault = 2;
    return value;
  }

  if ( !point )
  {
    value = 1.0;
  }

  if ( n < l || k < l )
  {
    *ifault = 2;
    return value;
  }

  *ifault = 0;
  value = 1.0;

  if ( k == 1 || k == m || n == 1 || n == m )
  {
    return value;
  }

  if ( !point && ll == i4_min ( kk, nn ) )
  {
    return value;
  }

  p = static_cast<double> ( nn ) / static_cast<double> ( mm - nn );

  if ( 16.0 * r8_max ( p, 1.0 / p ) 
    < static_cast<double> ( i4_min ( kk, mm - kk ) ) &&
    mvbig < mm && - 100.0 < elimit )
  {
//
//  Use a normal approximation.
//
    mean = static_cast<double> ( kk * nn ) / static_cast<double> ( mm );

    sig = sqrt ( mean * ( static_cast<double> ( mm - nn ) / static_cast<double> ( mm ) ) 
    * ( static_cast<double> ( mm - kk ) / ( static_cast<double> ( mm - 1 ) ) ) );

    if ( point )
    {
      arg = - 0.5 * ( pow ( ( static_cast<double> ( ll ) - mean ) / sig, 2 ) );
      if ( elimit <= arg )
      {
        value = exp ( arg ) / ( sig * rootpi );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
      value = alnorm ( ( static_cast<double> ( ll ) + 0.5 - mean ) / sig, false );
    }
  }
  else
  {
//
//  Calculate exact hypergeometric probabilities.
//  Interchange K and N if this saves calculations.
//
    if ( i4_min ( n - 1, m - n ) < i4_min ( k - 1, m - k ) )
    {
      i = k;
      k = n;
      n = i;
    }

    if ( m - k < k - 1 )
    {
      dir = !dir;
      l = n - l + 1;
      k = m - k + 1;
    }

    if ( mbig < mm )
    {
//
//  Take logarithms of factorials.
//
      p = alnfac ( nn ) 
        - alnfac ( mm ) 
        + alnfac ( mm - kk ) 
        + alnfac ( kk ) 
        + alnfac ( mm - nn ) 
        - alnfac ( ll ) 
        - alnfac ( nn - ll ) 
        - alnfac ( kk - ll ) 
        - alnfac ( mm - nn - kk + ll );

      if ( elimit <= p )
      {
        value = exp ( p );
      }
      else
      {
        value = 0.0;
      }
    }
    else
    {
//
//  Use Freeman/Lund algorithm.
//
      for ( i = 1; i <= l - 1; i++ )
      {
        value = value * static_cast<double> ( ( k - i ) * ( n - i ) ) 
        / static_cast<double> ( ( l - i ) * ( m - i ) );
      }

      if ( l != k )
      {
        j = m - n + l;
        for ( i = l; i <= k - 1; i++ )
        {
          value = value * static_cast<double> ( j - i ) / static_cast<double> ( m - i );
        }
      }
    }

    if ( point )
    {
      return value;
    }

    if ( value == 0.0 )
    {
//
//  We must recompute the point probability since it has underflowed.
//
      if ( mm <= mbig )
      {
        p = alnfac ( nn ) 
          - alnfac ( mm ) 
          + alnfac ( kk ) 
          + alnfac ( mm - nn ) 
          - alnfac ( ll ) 
          - alnfac ( nn - ll ) 
          - alnfac ( kk - ll ) 
          - alnfac ( mm - nn - kk + ll ) 
          + alnfac ( mm - kk );
      }

      p = p + log ( scale );

      if ( p < elimit )
      {
        *ifault = 3;
        if ( static_cast<double> ( nn * kk + nn + kk + 1 ) 
          / static_cast<double> ( mm + 2 ) < static_cast<double> ( ll ) )
        {
          value = 1.0;
        }
        return value;
      }
      else
      {
        p = exp ( p );
      }
    }
    else
//
//  Scale up at this point.
//
    {
      p = value * scale;
    }

    pt = 0.0;
    nl = n - l;
    kl = k - l;
    mnkl = m - n - kl + 1;

    if ( l <= kl )
    {
      for ( i = 1; i <= l - 1; i++ )
      {
        p = p * static_cast<double> ( ( l - i ) * ( mnkl - i ) ) / 
        static_cast<double> ( ( nl + i ) * ( kl + i ) );
        pt = pt + p;
      }
    }
    else
    {
      dir = !dir;
      for ( j = 0; j <= kl - 1; j++ )
      {
        p = p * static_cast<double> ( ( nl - j ) * ( kl - j ) ) 
        / static_cast<double> ( ( l + j ) * ( mnkl + j ) );
        pt = pt + p;
      }
    }

    if ( p == 0.0 )
    {
      *ifault = 3;
    }

    if ( dir )
    {
      value = value + ( pt / scale );
    }
    else
    {
      value = 1.0 - ( pt / scale );
    }
  }

  return value;
}